

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O0

void prf_color_palette_entry_f(prf_node_t *node,prf_state_t *state)

{
  long in_RSI;
  ushort *in_RDI;
  
  if (*in_RDI == prf_color_palette_info.opcode) {
    if ((*(long *)(in_RSI + 0x20) == 0) || (*(ushort **)(in_RSI + 0x20) == in_RDI)) {
      *(ushort **)(in_RSI + 0x20) = in_RDI;
    }
    else {
      prf_error(9,"color palette entry: a color palette is already registered");
    }
  }
  else {
    prf_error(9,"color palette entry state method tried on node of type %d.",(ulong)*in_RDI);
  }
  return;
}

Assistant:

static
void
prf_color_palette_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 9,
            "color palette entry state method tried on node of type %d.",
            node->opcode );
        return;
    }
    if ( state->color_palette != NULL && state->color_palette != node ) {
        prf_error( 9,
            "color palette entry: a color palette is already registered" );
        return;
    }

    state->color_palette = node;
}